

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall
XPMP2::SocketNetworking::Open
          (SocketNetworking *this,string *_addr,int _port,size_t _bufSize,uint _timeOut_ms,
          bool _bBroadcast)

{
  string *__rhs;
  int iVar1;
  NetRuntimeError *pNVar2;
  addrinfo *addrinfo;
  int setToVal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string decimal_port;
  addrinfo hints;
  timeval timeout;
  
  addrinfo = (addrinfo *)0x0;
  this->f_port = _port;
  __rhs = &this->f_addr;
  std::__cxx11::string::_M_assign((string *)__rhs);
  std::__cxx11::to_string(&decimal_port,this->f_port);
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_flags = 0;
  hints.ai_family = 0;
  hints.ai_socktype = 0;
  hints.ai_protocol = 0;
  (*this->_vptr_SocketNetworking[6])(this);
  if ((this->f_addr)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)__rhs);
  }
  iVar1 = getaddrinfo((__rhs->_M_dataplus)._M_p,decimal_port._M_dataplus._M_p,(addrinfo *)&hints,
                      (addrinfo **)&addrinfo);
  if ((iVar1 != 0) || (addrinfo == (addrinfo *)0x0)) {
    pNVar2 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_108,"invalid address or port for socket: \"",__rhs);
    std::operator+(&local_e8,&local_108,":");
    std::operator+(&local_c8,&local_e8,&decimal_port);
    std::operator+(&local_a8,&local_c8,"\"");
    NetRuntimeError::NetRuntimeError(pNVar2,&local_a8);
    __cxa_throw(pNVar2,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  iVar1 = socket(addrinfo->ai_family,addrinfo->ai_socktype,addrinfo->ai_protocol);
  this->f_socket = iVar1;
  if (iVar1 == -1) {
    pNVar2 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_108,"could not create socket for: \"",__rhs);
    std::operator+(&local_e8,&local_108,":");
    std::operator+(&local_c8,&local_e8,&decimal_port);
    std::operator+(&local_a8,&local_c8,"\"");
    NetRuntimeError::NetRuntimeError(pNVar2,&local_a8);
    __cxa_throw(pNVar2,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  setToVal = 1;
  iVar1 = setsockopt(iVar1,1,2,&setToVal,4);
  if (iVar1 < 0) {
    pNVar2 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_108,"could not setsockopt SO_REUSEADDR for: \"",__rhs);
    std::operator+(&local_e8,&local_108,":");
    std::operator+(&local_c8,&local_e8,&decimal_port);
    std::operator+(&local_a8,&local_c8,"\"");
    NetRuntimeError::NetRuntimeError(pNVar2,&local_a8);
    __cxa_throw(pNVar2,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  iVar1 = setsockopt(this->f_socket,1,0xf,&setToVal,4);
  if (iVar1 < 0) {
    pNVar2 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_108,"could not setsockopt SO_REUSEPORT for: \"",__rhs);
    std::operator+(&local_e8,&local_108,":");
    std::operator+(&local_c8,&local_e8,&decimal_port);
    std::operator+(&local_a8,&local_c8,"\"");
    NetRuntimeError::NetRuntimeError(pNVar2,&local_a8);
    __cxa_throw(pNVar2,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  timeout.tv_sec = (ulong)_timeOut_ms / 1000;
  timeout.tv_usec = (__suseconds_t)((_timeOut_ms % 1000) * 1000);
  iVar1 = setsockopt(this->f_socket,1,0x14,&timeout,0x10);
  if (iVar1 < 0) {
    pNVar2 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_108,"could not setsockopt SO_RCVTIMEO for: \"",__rhs);
    std::operator+(&local_e8,&local_108,":");
    std::operator+(&local_c8,&local_e8,&decimal_port);
    std::operator+(&local_a8,&local_c8,"\"");
    NetRuntimeError::NetRuntimeError(pNVar2,&local_a8);
    __cxa_throw(pNVar2,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  if (_bBroadcast) {
    setToVal = 1;
    iVar1 = setsockopt(this->f_socket,1,6,&setToVal,4);
    if (iVar1 < 0) {
      pNVar2 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::operator+(&local_108,"could not setsockopt SO_BROADCAST for: \"",__rhs);
      std::operator+(&local_e8,&local_108,":");
      std::operator+(&local_c8,&local_e8,&decimal_port);
      std::operator+(&local_a8,&local_c8,"\"");
      NetRuntimeError::NetRuntimeError(pNVar2,&local_a8);
      __cxa_throw(pNVar2,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
  }
  iVar1 = bind(this->f_socket,(sockaddr *)addrinfo->ai_addr,addrinfo->ai_addrlen);
  if (iVar1 == 0) {
    freeaddrinfo((addrinfo *)addrinfo);
    addrinfo = (addrinfo *)0x0;
    SetBufSize(this,_bufSize);
    std::__cxx11::string::~string((string *)&decimal_port);
    return;
  }
  pNVar2 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_108,"could not bind UDP socket with: \"",__rhs);
  std::operator+(&local_e8,&local_108,":");
  std::operator+(&local_c8,&local_e8,&decimal_port);
  std::operator+(&local_a8,&local_c8,"\"");
  NetRuntimeError::NetRuntimeError(pNVar2,&local_a8);
  __cxa_throw(pNVar2,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
}

Assistant:

void SocketNetworking::Open(const std::string& _addr, int _port,
                       size_t _bufSize, unsigned _timeOut_ms, bool _bBroadcast)
{
    struct addrinfo *   addrinfo      = NULL;
    try {
        // store member values
        f_port = _port;
        f_addr = _addr;
        const std::string decimal_port(std::to_string(f_port));

        // get a valid address based on inAddr/port
        struct addrinfo hints;
        memset(&hints, 0, sizeof(hints));
        GetAddrHints(hints);            // ask subclasses
        
        // Any address?
        if (f_addr.empty())
            f_addr = hints.ai_family == AF_INET6 ? "::" : "0.0.0.0";
        
        // Need to get
        int r = getaddrinfo(f_addr.c_str(),
                            decimal_port.c_str(), &hints, &addrinfo);
        if(r != 0 || addrinfo == NULL)
            throw NetRuntimeError("invalid address or port for socket: \"" + f_addr + ":" + decimal_port + "\"");
        
        // get a socket
        f_socket = socket(addrinfo->ai_family, addrinfo->ai_socktype, addrinfo->ai_protocol);
        if(f_socket == INVALID_SOCKET)
            throw NetRuntimeError("could not create socket for: \"" + f_addr + ":" + decimal_port + "\"");
        
        // Reuse address and port to allow others to connect, too
        int setToVal = 1;
#if IBM
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEADDR, (char*)&setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEADDR for: \"" + f_addr + ":" + decimal_port + "\"");
#else
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEADDR, &setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEADDR for: \"" + f_addr + ":" + decimal_port + "\"");
        if (setsockopt(f_socket, SOL_SOCKET, SO_REUSEPORT, &setToVal, sizeof(setToVal)) < 0)
            throw NetRuntimeError("could not setsockopt SO_REUSEPORT for: \"" + f_addr + ":" + decimal_port + "\"");
#endif

        // define receive timeout
#if IBM
        DWORD wsTimeout = _timeOut_ms;
        if (setsockopt(f_socket, SOL_SOCKET, SO_RCVTIMEO, (char*)&wsTimeout, sizeof(wsTimeout)) < 0)
            throw NetRuntimeError("could not setsockopt SO_RCVTIMEO for: \"" + f_addr + ":" + decimal_port + "\"");
#else
        struct timeval timeout;
        timeout.tv_sec = _timeOut_ms / 1000;
        timeout.tv_usec = (_timeOut_ms % 1000) * 1000;
        if (setsockopt(f_socket, SOL_SOCKET, SO_RCVTIMEO, &timeout, sizeof(timeout)) < 0)
            throw NetRuntimeError("could not setsockopt SO_RCVTIMEO for: \"" + f_addr + ":" + decimal_port + "\"");
#endif
        
        // if requested allow for sending broadcasts
        if (_bBroadcast) {
            setToVal = 1;
#if IBM
            if (setsockopt(f_socket, SOL_SOCKET, SO_BROADCAST, (char*)&setToVal, sizeof(setToVal)) < 0)
                throw NetRuntimeError("could not setsockopt SO_BROADCAST for: \"" + f_addr + ":" + decimal_port + "\"");
#else
            if (setsockopt(f_socket, SOL_SOCKET, SO_BROADCAST, &setToVal, sizeof(setToVal)) < 0)
                throw NetRuntimeError("could not setsockopt SO_BROADCAST for: \"" + f_addr + ":" + decimal_port + "\"");
#endif
        }

        // bind the socket to the address:port
        r = bind(f_socket, addrinfo->ai_addr, (socklen_t)addrinfo->ai_addrlen);
        if(r != 0)
            throw NetRuntimeError("could not bind UDP socket with: \"" + f_addr + ":" + decimal_port + "\"");

        // free adress info
        freeaddrinfo(addrinfo);
        addrinfo = NULL;

        // reserve receive buffer
        SetBufSize(_bufSize);
    }
    catch (...) {
        // free adress info
        if (addrinfo) {
            freeaddrinfo(addrinfo);
            addrinfo = NULL;
        }
        // make sure everything is closed
        Close();
        // re-throw
        throw;
    }
}